

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

UObject * __thiscall
icu_63::NFFactory::create(NFFactory *this,ICUServiceKey *key,ICUService *service,UErrorCode *status)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  NFFactory *local_130;
  UObject *result;
  int32_t kind;
  undefined1 local_118 [8];
  Locale loc;
  LocaleKey *lkey;
  UErrorCode *status_local;
  ICUService *service_local;
  ICUServiceKey *key_local;
  NFFactory *this_local;
  
  iVar1 = (*(this->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject[6])
                    (this,key,status);
  if ((char)iVar1 == '\0') {
    this_local = (NFFactory *)0x0;
  }
  else {
    loc._216_8_ = key;
    Locale::Locale((Locale *)local_118);
    (**(code **)(*(long *)loc._216_8_ + 0x58))(loc._216_8_,(Locale *)local_118);
    uVar2 = (**(code **)(*(long *)loc._216_8_ + 0x50))();
    iVar1 = (*(this->_delegate->super_UObject)._vptr_UObject[5])
                      (this->_delegate,local_118,(ulong)uVar2);
    local_130 = (NFFactory *)CONCAT44(extraout_var,iVar1);
    if (local_130 == (NFFactory *)0x0) {
      local_130 = (NFFactory *)
                  ICUService::getKey(service,key,(UnicodeString *)0x0,(ICUServiceFactory *)this,
                                     status);
    }
    this_local = local_130;
    Locale::~Locale((Locale *)local_118);
  }
  return (UObject *)this_local;
}

Assistant:

virtual UObject* create(const ICUServiceKey& key, const ICUService* service, UErrorCode& status) const
    {
        if (handlesKey(key, status)) {
            const LocaleKey& lkey = (const LocaleKey&)key;
            Locale loc;
            lkey.canonicalLocale(loc);
            int32_t kind = lkey.kind();

            UObject* result = _delegate->createFormat(loc, (UNumberFormatStyle)kind);
            if (result == NULL) {
                result = service->getKey((ICUServiceKey&)key /* cast away const */, NULL, this, status);
            }
            return result;
        }
        return NULL;
    }